

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

escapeitem_t item_to_escapeitem(item_t item)

{
  escapeitem_t eVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,item);
  if (iVar2 == 0xf) {
    eVar1 = 1;
  }
  else if (iVar2 == 6) {
    eVar1 = 8;
  }
  else if (iVar2 == 0xe) {
    eVar1 = 4;
  }
  else {
    if (iVar2 != 3) {
      return 0;
    }
    eVar1 = 2;
  }
  return eVar1;
}

Assistant:

escapeitem_t item_to_escapeitem(item_t item)
{
  switch (item)
  {
  case item_COMPASS:
    return escapeitem_COMPASS;
  case item_PAPERS:
    return escapeitem_PAPERS;
  case item_PURSE:
    return escapeitem_PURSE;
  case item_UNIFORM:
    return escapeitem_UNIFORM;
  default:
    return 0;
  }
}